

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O2

REF_STATUS
ref_clump_between_export_to(REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  REF_NODE pRVar3;
  REF_NODE ref_node;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  REF_ADJ_ITEM pRVar9;
  long global;
  undefined8 uVar10;
  long lVar11;
  REF_INT *pRVar12;
  int iVar13;
  REF_INT RVar14;
  char *pcVar15;
  ulong uVar16;
  REF_INT new_cell;
  uint local_f0;
  REF_INT local_ec;
  long local_e8;
  REF_DICT node_dict;
  REF_CELL local_d8;
  REF_GRID_conflict loc_grid;
  REF_CELL local_c8;
  ulong local_c0;
  REF_GRID_conflict local_b8;
  REF_INT new_node;
  REF_INT nodes [27];
  
  uVar6 = ref_grid_create(&loc_grid,ref_grid->mpi);
  if (uVar6 == 0) {
    uVar6 = ref_dict_create(&node_dict);
    if (uVar6 == 0) {
      pRVar1 = ref_grid->cell[3];
      local_d8 = (REF_CELL)(ulong)(uint)node0;
      uVar16 = 0xffffffff;
      RVar14 = -1;
      if (-1 < node0) {
        pRVar2 = pRVar1->ref_adj;
        uVar16 = 0xffffffff;
        RVar14 = -1;
        if (node0 < pRVar2->nnode) {
          uVar6 = pRVar2->first[(long)local_d8];
          uVar16 = 0xffffffff;
          RVar14 = -1;
          if ((long)(int)uVar6 != -1) {
            RVar14 = pRVar2->item[(int)uVar6].ref;
            uVar16 = (ulong)uVar6;
          }
        }
      }
      local_f0 = node1;
      local_ec = node0;
      local_b8 = ref_grid;
      while( true ) {
        if ((int)uVar16 == -1) {
          local_c0 = (ulong)local_f0;
          RVar14 = -1;
          iVar8 = -1;
          if ((int)local_f0 < 0) goto LAB_001c7aca;
          pRVar2 = pRVar1->ref_adj;
          RVar14 = -1;
          if (pRVar2->nnode <= (int)local_f0) goto LAB_001c7aca;
          iVar13 = pRVar2->first[local_c0];
          RVar14 = -1;
          if (iVar13 == -1) goto LAB_001c7aca;
          pRVar9 = pRVar2->item;
          do {
            RVar14 = pRVar9[iVar13].ref;
            iVar8 = iVar13;
LAB_001c7aca:
            iVar13 = iVar8;
            do {
              if (iVar13 == -1) {
                pRVar1 = local_b8->cell[8];
                uVar16 = 0xffffffff;
                RVar14 = -1;
                if (-1 < local_ec) {
                  pRVar2 = pRVar1->ref_adj;
                  uVar16 = 0xffffffff;
                  RVar14 = -1;
                  if (local_ec < pRVar2->nnode) {
                    uVar6 = pRVar2->first[(long)local_d8];
                    uVar16 = 0xffffffff;
                    RVar14 = -1;
                    if ((long)(int)uVar6 != -1) {
                      RVar14 = pRVar2->item[(int)uVar6].ref;
                      uVar16 = (ulong)uVar6;
                    }
                  }
                }
                goto LAB_001c7bcd;
              }
              uVar6 = ref_cell_nodes(pRVar1,RVar14,nodes);
              if (uVar6 != 0) {
                pcVar15 = "n";
                uVar10 = 0x118;
                goto LAB_001c7a63;
              }
              lVar11 = 0;
              while (lVar11 < pRVar1->node_per) {
                uVar6 = ref_dict_store(node_dict,nodes[lVar11],0);
                lVar11 = lVar11 + 1;
                if (uVar6 != 0) {
                  pcVar15 = "store";
                  uVar10 = 0x11a;
                  goto LAB_001c7a63;
                }
              }
              pRVar9 = pRVar1->ref_adj->item;
              iVar13 = pRVar9[iVar13].next;
              RVar14 = -1;
            } while (iVar13 == -1);
          } while( true );
        }
        uVar6 = ref_cell_nodes(pRVar1,RVar14,nodes);
        if (uVar6 != 0) break;
        lVar11 = 0;
        while (lVar11 < pRVar1->node_per) {
          uVar6 = ref_dict_store(node_dict,nodes[lVar11],0);
          lVar11 = lVar11 + 1;
          if (uVar6 != 0) {
            pcVar15 = "store";
            uVar10 = 0x115;
            goto LAB_001c7a63;
          }
        }
        pRVar9 = pRVar1->ref_adj->item;
        uVar16 = (ulong)pRVar9[(int)uVar16].next;
        RVar14 = -1;
        if (uVar16 != 0xffffffffffffffff) {
          RVar14 = pRVar9[uVar16].ref;
        }
      }
      pcVar15 = "n";
      uVar10 = 0x113;
    }
    else {
      pcVar15 = "create nodes";
      uVar10 = 0x10f;
    }
  }
  else {
    pcVar15 = "create grid";
    uVar10 = 0x10d;
  }
  goto LAB_001c7a63;
LAB_001c7bcd:
  if ((int)uVar16 == -1) {
    RVar14 = -1;
    iVar8 = -1;
    if ((int)local_f0 < 0) goto LAB_001c7cc0;
    pRVar2 = pRVar1->ref_adj;
    RVar14 = -1;
    if (pRVar2->nnode <= (int)local_f0) goto LAB_001c7cc0;
    iVar13 = pRVar2->first[local_c0];
    RVar14 = -1;
    if (iVar13 == -1) goto LAB_001c7cc0;
    pRVar9 = pRVar2->item;
    do {
      RVar14 = pRVar9[iVar13].ref;
      iVar8 = iVar13;
LAB_001c7cc0:
      do {
        if (iVar8 == -1) {
          iVar8 = node_dict->n;
          iVar13 = -1;
          if (0 < iVar8) {
            iVar13 = *node_dict->key;
          }
          pRVar3 = local_b8->node;
          ref_node = loc_grid->node;
          lVar11 = 0;
          goto LAB_001c7d95;
        }
        uVar6 = ref_cell_nodes(pRVar1,RVar14,nodes);
        if (uVar6 != 0) {
          pcVar15 = "n";
          uVar10 = 0x124;
          goto LAB_001c7a63;
        }
        lVar11 = 0;
        while (lVar11 < pRVar1->node_per) {
          uVar6 = ref_dict_store(node_dict,nodes[lVar11],0);
          lVar11 = lVar11 + 1;
          if (uVar6 != 0) {
            pcVar15 = "store";
            uVar10 = 0x126;
            goto LAB_001c7a63;
          }
        }
        pRVar9 = pRVar1->ref_adj->item;
        iVar13 = pRVar9[iVar8].next;
        RVar14 = -1;
        iVar8 = iVar13;
      } while (iVar13 == -1);
    } while( true );
  }
  uVar6 = ref_cell_nodes(pRVar1,RVar14,nodes);
  if (uVar6 != 0) {
    pcVar15 = "n";
    uVar10 = 0x11f;
    goto LAB_001c7a63;
  }
  lVar11 = 0;
  while (lVar11 < pRVar1->node_per) {
    uVar6 = ref_dict_store(node_dict,nodes[lVar11],0);
    lVar11 = lVar11 + 1;
    if (uVar6 != 0) {
      pcVar15 = "store";
      uVar10 = 0x121;
      goto LAB_001c7a63;
    }
  }
  pRVar9 = pRVar1->ref_adj->item;
  uVar16 = (ulong)pRVar9[(int)uVar16].next;
  RVar14 = -1;
  if (uVar16 != 0xffffffffffffffff) {
    RVar14 = pRVar9[uVar16].ref;
  }
  goto LAB_001c7bcd;
LAB_001c7d95:
  global = lVar11;
  if (global < iVar8) {
    uVar6 = ref_node_add(ref_node,global,&new_node);
    if (uVar6 != 0) {
      pcVar15 = "new_node";
      uVar10 = 300;
      goto LAB_001c7a63;
    }
    pRVar4 = pRVar3->real;
    pRVar5 = ref_node->real;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      pRVar5[new_node * 0xf + lVar11] = pRVar4[iVar13 * 0xf + lVar11];
    }
    lVar11 = global + 1;
    iVar8 = node_dict->n;
    iVar13 = -1;
    if ((int)lVar11 < iVar8) {
      iVar13 = node_dict->key[global + 1];
    }
    goto LAB_001c7d95;
  }
  uVar6 = ref_node_initialize_n_global(ref_node,(long)iVar8);
  if (uVar6 == 0) {
    pRVar1 = local_b8->cell[8];
    RVar14 = -1;
    local_e8 = 0xffffffff;
    if (-1 < local_ec) {
      pRVar2 = pRVar1->ref_adj;
      local_e8 = 0xffffffff;
      if (local_ec < pRVar2->nnode) {
        lVar11 = (long)pRVar2->first[(long)local_d8];
        RVar14 = -1;
        local_e8 = 0xffffffff;
        if (lVar11 != -1) {
          RVar14 = pRVar2->item[lVar11].ref;
          local_e8 = lVar11;
        }
      }
    }
    local_c8 = loc_grid->cell[8];
    uVar6 = 0;
    while ((int)local_e8 != -1) {
      uVar7 = ref_cell_nodes(pRVar1,RVar14,nodes);
      if (uVar7 != 0) {
        pcVar15 = "n";
        uVar10 = 0x138;
        goto LAB_001c8083;
      }
      pRVar12 = nodes;
      lVar11 = 0;
      while (lVar11 < pRVar1->node_per) {
        uVar7 = ref_dict_location(node_dict,*pRVar12,pRVar12);
        lVar11 = lVar11 + 1;
        pRVar12 = pRVar12 + 1;
        if (uVar7 != 0) {
          uVar10 = 0x13b;
LAB_001c801d:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 uVar10,"ref_clump_between_export_to",(ulong)uVar7,"map");
          return uVar7;
        }
      }
      uVar7 = ref_cell_with(local_c8,nodes,&new_cell);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x13d,"ref_clump_between_export_to",(ulong)uVar7,"exists?");
        uVar6 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar6;
      }
      if ((new_cell == -1) && (uVar7 = ref_cell_add(local_c8,nodes,&new_cell), uVar7 != 0)) {
        pcVar15 = "new cell";
        uVar10 = 0x13f;
        goto LAB_001c8083;
      }
      pRVar9 = pRVar1->ref_adj->item;
      local_e8 = (long)pRVar9[(int)local_e8].next;
      RVar14 = -1;
      if (local_e8 != -1) {
        RVar14 = pRVar9[local_e8].ref;
      }
    }
    if ((-1 < (int)local_f0) && (pRVar2 = pRVar1->ref_adj, (int)local_f0 < pRVar2->nnode)) {
      local_e8 = CONCAT44(local_e8._4_4_,pRVar2->first[local_c0]);
      if (pRVar2->first[local_c0] != -1) {
        pRVar9 = pRVar2->item;
        goto LAB_001c818b;
      }
    }
    RVar14 = -1;
    local_e8 = CONCAT44(local_e8._4_4_,0xffffffff);
    while ((int)local_e8 != -1) {
      uVar7 = ref_cell_nodes(pRVar1,RVar14,nodes);
      if (uVar7 != 0) {
        pcVar15 = "n";
        uVar10 = 0x143;
        goto LAB_001c8083;
      }
      pRVar12 = nodes;
      lVar11 = 0;
      while (lVar11 < pRVar1->node_per) {
        uVar7 = ref_dict_location(node_dict,*pRVar12,pRVar12);
        lVar11 = lVar11 + 1;
        pRVar12 = pRVar12 + 1;
        if (uVar7 != 0) {
          uVar10 = 0x146;
          goto LAB_001c801d;
        }
      }
      uVar7 = ref_cell_with(local_c8,nodes,&new_cell);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x148,"ref_clump_between_export_to",(ulong)uVar7,"exists?");
        uVar6 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar6;
      }
      if ((new_cell == -1) && (uVar7 = ref_cell_add(local_c8,nodes,&new_cell), uVar7 != 0)) {
        pcVar15 = "new cell";
        uVar10 = 0x14a;
        goto LAB_001c8083;
      }
      pRVar9 = pRVar1->ref_adj->item;
      lVar11 = (long)(int)local_e8;
      RVar14 = -1;
      local_e8 = CONCAT44(local_e8._4_4_,pRVar9[lVar11].next);
      if (pRVar9[lVar11].next != -1) {
LAB_001c818b:
        RVar14 = pRVar9[(int)local_e8].ref;
      }
    }
    pRVar1 = local_b8->cell[3];
    RVar14 = -1;
    uVar16 = 0xffffffff;
    if (-1 < local_ec) {
      pRVar2 = pRVar1->ref_adj;
      uVar16 = 0xffffffff;
      if (local_ec < pRVar2->nnode) {
        uVar7 = pRVar2->first[(long)local_d8];
        RVar14 = -1;
        uVar16 = 0xffffffff;
        if ((long)(int)uVar7 != -1) {
          RVar14 = pRVar2->item[(int)uVar7].ref;
          uVar16 = (ulong)uVar7;
        }
      }
    }
    local_d8 = loc_grid->cell[3];
    do {
      if ((int)uVar16 == -1) {
        if ((((int)local_f0 < 0) || (pRVar2 = pRVar1->ref_adj, pRVar2->nnode <= (int)local_f0)) ||
           (iVar8 = pRVar2->first[local_c0], iVar8 == -1)) {
          iVar8 = -1;
          RVar14 = -1;
          goto LAB_001c8409;
        }
        pRVar9 = pRVar2->item;
        do {
          RVar14 = pRVar9[iVar8].ref;
LAB_001c8409:
          do {
            if (iVar8 == -1) {
              uVar6 = ref_dict_location(node_dict,local_ec,nodes);
              if (uVar6 == 0) {
                uVar6 = ref_dict_location(node_dict,local_f0,nodes + 1);
                if (uVar6 == 0) {
                  printf("node0 %d node1 %d\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1]);
                  uVar6 = ref_dict_free(node_dict);
                  if (uVar6 == 0) {
                    uVar6 = ref_export_by_extension(loc_grid,filename);
                    if (uVar6 == 0) {
                      uVar6 = ref_grid_free(loc_grid);
                      if (uVar6 == 0) {
                        return 0;
                      }
                      pcVar15 = "free loc grid";
                      uVar10 = 0x16f;
                    }
                    else {
                      pcVar15 = "dump";
                      uVar10 = 0x16d;
                    }
                  }
                  else {
                    pcVar15 = "free nodes";
                    uVar10 = 0x16b;
                  }
                }
                else {
                  pcVar15 = "map1";
                  uVar10 = 0x168;
                }
              }
              else {
                pcVar15 = "map0";
                uVar10 = 0x167;
              }
              goto LAB_001c7a63;
            }
            uVar7 = ref_cell_nodes(pRVar1,RVar14,nodes);
            if (uVar7 != 0) {
              pcVar15 = "n";
              uVar10 = 0x15c;
              goto LAB_001c8083;
            }
            pRVar12 = nodes;
            lVar11 = 0;
            while (lVar11 < pRVar1->node_per) {
              uVar7 = ref_dict_location(node_dict,*pRVar12,pRVar12);
              lVar11 = lVar11 + 1;
              pRVar12 = pRVar12 + 1;
              if (uVar7 != 0) {
                uVar10 = 0x15f;
                goto LAB_001c801d;
              }
            }
            uVar7 = ref_cell_with(local_d8,nodes,&new_cell);
            if ((uVar7 != 0) && (uVar7 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0x161,"ref_clump_between_export_to",(ulong)uVar7,"exists?");
              uVar6 = uVar7;
            }
            if ((uVar7 != 5) && (uVar7 != 0)) {
              return uVar6;
            }
            if ((new_cell == -1) && (uVar7 = ref_cell_add(local_d8,nodes,&new_cell), uVar7 != 0)) {
              pcVar15 = "new cell";
              uVar10 = 0x163;
              goto LAB_001c8083;
            }
            pRVar9 = pRVar1->ref_adj->item;
            iVar8 = pRVar9[iVar8].next;
            RVar14 = -1;
          } while (iVar8 == -1);
        } while( true );
      }
      uVar7 = ref_cell_nodes(pRVar1,RVar14,nodes);
      if (uVar7 != 0) {
        pcVar15 = "n";
        uVar10 = 0x151;
LAB_001c8083:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               uVar10,"ref_clump_between_export_to",(ulong)uVar7,pcVar15);
        return uVar7;
      }
      pRVar12 = nodes;
      lVar11 = 0;
      while (lVar11 < pRVar1->node_per) {
        uVar7 = ref_dict_location(node_dict,*pRVar12,pRVar12);
        lVar11 = lVar11 + 1;
        pRVar12 = pRVar12 + 1;
        if (uVar7 != 0) {
          uVar10 = 0x154;
          goto LAB_001c801d;
        }
      }
      uVar7 = ref_cell_with(local_d8,nodes,&new_cell);
      if ((uVar7 != 0) && (uVar7 != 5)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x156,"ref_clump_between_export_to",(ulong)uVar7,"exists?");
        uVar6 = uVar7;
      }
      if ((uVar7 != 5) && (uVar7 != 0)) {
        return uVar6;
      }
      if ((new_cell == -1) && (uVar7 = ref_cell_add(local_d8,nodes,&new_cell), uVar7 != 0)) {
        pcVar15 = "new cell";
        uVar10 = 0x158;
        goto LAB_001c8083;
      }
      pRVar9 = pRVar1->ref_adj->item;
      uVar16 = (ulong)pRVar9[(int)uVar16].next;
      RVar14 = -1;
      if (uVar16 != 0xffffffffffffffff) {
        RVar14 = pRVar9[uVar16].ref;
      }
    } while( true );
  }
  pcVar15 = "init glob";
  uVar10 = 0x133;
LAB_001c7a63:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar10,
         "ref_clump_between_export_to",(ulong)uVar6,pcVar15);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between_export_to(REF_GRID ref_grid, REF_INT node0,
                                               REF_INT node1,
                                               const char *filename) {
  REF_GRID loc_grid;
  REF_NODE ref_node, loc_node;
  REF_CELL ref_cell, loc_cell;
  REF_INT item, cell, cell_node;
  REF_INT old, index, new_cell, new_node, ixyz;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DICT node_dict;

  RSS(ref_grid_create(&loc_grid, ref_grid_mpi(ref_grid)), "create grid");

  RSS(ref_dict_create(&node_dict), "create nodes");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  ref_node = ref_grid_node(ref_grid);
  loc_node = ref_grid_node(loc_grid);
  each_ref_dict_key(node_dict, index, old) {
    RSS(ref_node_add(loc_node, index, &new_node), "new_node");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      ref_node_xyz(loc_node, ixyz, new_node) =
          ref_node_xyz(ref_node, ixyz, old);
    }
  }
  RSS(ref_node_initialize_n_global(loc_node, ref_dict_n(node_dict)),
      "init glob");

  ref_cell = ref_grid_tet(ref_grid);
  loc_cell = ref_grid_tet(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  loc_cell = ref_grid_tri(loc_grid);
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      old = nodes[cell_node];
      RSS(ref_dict_location(node_dict, old, &(nodes[cell_node])), "map");
    }
    RXS(ref_cell_with(loc_cell, nodes, &new_cell), REF_NOT_FOUND, "exists?");
    if (REF_EMPTY == new_cell) {
      RSS(ref_cell_add(loc_cell, nodes, &new_cell), "new cell");
    }
  }

  RSS(ref_dict_location(node_dict, node0, &(nodes[0])), "map0");
  RSS(ref_dict_location(node_dict, node1, &(nodes[1])), "map1");
  printf("node0 %d node1 %d\n", nodes[0], nodes[1]);

  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_export_by_extension(loc_grid, filename), "dump");

  RSS(ref_grid_free(loc_grid), "free loc grid");

  return REF_SUCCESS;
}